

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O2

void __thiscall
HighsMipSolverData::finishAnalyticCenterComputation(HighsMipSolverData *this,TaskGroup *taskGroup)

{
  HighsOptions *pHVar1;
  HighsLp *pHVar2;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var3;
  HighsMipSolver *pHVar4;
  uint uVar5;
  uint uVar7;
  ulong uVar8;
  double dVar9;
  double dVar11;
  HighsDomainChange boundchg;
  ulong uVar6;
  double dVar10;
  
  pHVar4 = this->mipsolver;
  if ((pHVar4->analysis_).analyse_mip_time == true) {
    pHVar1 = pHVar4->options_mip_;
    HighsMipAnalysis::mipTimerRead(&pHVar4->analysis_,0);
    highsLogUser(&(pHVar1->super_HighsOptionsStruct).log_options,kInfo,
                 "MIP-Timing: %11.2g - starting  analytic centre synch\n");
    fflush(_stdout);
  }
  ::highs::parallel::TaskGroup::sync(taskGroup);
  pHVar4 = this->mipsolver;
  if ((pHVar4->analysis_).analyse_mip_time == true) {
    pHVar1 = pHVar4->options_mip_;
    HighsMipAnalysis::mipTimerRead(&pHVar4->analysis_,0);
    highsLogUser(&(pHVar1->super_HighsOptionsStruct).log_options,kInfo,
                 "MIP-Timing: %11.2g - completed analytic centre synch\n");
    fflush(_stdout);
  }
  this->analyticCenterComputed = true;
  if (this->analyticCenterStatus != kOptimal) {
    return;
  }
  pHVar4 = this->mipsolver;
  uVar8 = 0;
  uVar5 = 0;
  uVar7 = 0;
  do {
    pHVar2 = pHVar4->model_;
    if (uVar8 == (uint)pHVar2->num_col_) {
      if (0 < (int)uVar7) {
        highsLogDev(&(pHVar4->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
                    "Fixing %d columns (%d integers) sitting at bound at analytic center\n",
                    (ulong)uVar7,(ulong)uVar5);
        pHVar4 = this->mipsolver;
      }
      HighsDomain::propagate
                (&((pHVar4->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->domain);
      return;
    }
    _Var3._M_head_impl =
         (pHVar4->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    dVar9 = *(double *)
             (*(long *)&((vector<double,_std::allocator<double>_> *)
                        ((long)&(_Var3._M_head_impl)->domain + 800))->
                        super__Vector_base<double,_std::allocator<double>_> + uVar8 * 8) -
            *(double *)
             (*(long *)&((vector<double,_std::allocator<double>_> *)
                        ((long)&(_Var3._M_head_impl)->domain + 0x308))->
                        super__Vector_base<double,_std::allocator<double>_> + uVar8 * 8);
    if ((dVar9 != 0.0) || (NAN(dVar9))) {
      dVar11 = 1.0;
      if (dVar9 <= 1.0) {
        dVar11 = dVar9;
      }
      dVar11 = dVar11 * (_Var3._M_head_impl)->feastol;
      dVar9 = (this->analyticCenter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8];
      dVar10 = (pHVar2->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8];
      if (dVar9 <= dVar11 + dVar10) {
        uVar6 = uVar8 + 0x100000000;
      }
      else {
        dVar10 = (pHVar2->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar8];
        uVar6 = uVar8;
        if (dVar9 < dVar10 - dVar11) goto LAB_002c0c3f;
      }
      boundchg.column = (int)uVar6;
      boundchg.boundtype = (int)(uVar6 >> 0x20);
      boundchg.boundval = dVar10;
      HighsDomain::changeBound(&(_Var3._M_head_impl)->domain,boundchg,(Reason)0xfffffffe);
      pHVar4 = this->mipsolver;
      if (*(bool *)((long)&((pHVar4->mipdata_)._M_t.
                            super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                            .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                           domain + 0x280) != false) {
        return;
      }
      uVar7 = uVar7 + 1;
      uVar5 = uVar5 + ((pHVar4->model_->integrality_).
                       super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar8] == kInteger);
    }
LAB_002c0c3f:
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void HighsMipSolverData::finishAnalyticCenterComputation(
    const highs::parallel::TaskGroup& taskGroup) {
  if (mipsolver.analysis_.analyse_mip_time) {
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 "MIP-Timing: %11.2g - starting  analytic centre synch\n",
                 mipsolver.analysis_.mipTimerRead());
    fflush(stdout);
  }
  taskGroup.sync();
  if (mipsolver.analysis_.analyse_mip_time) {
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 "MIP-Timing: %11.2g - completed analytic centre synch\n",
                 mipsolver.analysis_.mipTimerRead());
    fflush(stdout);
  }
  analyticCenterComputed = true;
  if (analyticCenterStatus == HighsModelStatus::kOptimal) {
    HighsInt nfixed = 0;
    HighsInt nintfixed = 0;
    for (HighsInt i = 0; i != mipsolver.numCol(); ++i) {
      double boundRange = mipsolver.mipdata_->domain.col_upper_[i] -
                          mipsolver.mipdata_->domain.col_lower_[i];
      if (boundRange == 0.0) continue;

      double tolerance =
          mipsolver.mipdata_->feastol * std::min(boundRange, 1.0);

      if (analyticCenter[i] <= mipsolver.model_->col_lower_[i] + tolerance) {
        mipsolver.mipdata_->domain.changeBound(
            HighsBoundType::kUpper, i, mipsolver.model_->col_lower_[i],
            HighsDomain::Reason::unspecified());
        if (mipsolver.mipdata_->domain.infeasible()) return;
        ++nfixed;
        if (mipsolver.variableType(i) == HighsVarType::kInteger) ++nintfixed;
      } else if (analyticCenter[i] >=
                 mipsolver.model_->col_upper_[i] - tolerance) {
        mipsolver.mipdata_->domain.changeBound(
            HighsBoundType::kLower, i, mipsolver.model_->col_upper_[i],
            HighsDomain::Reason::unspecified());
        if (mipsolver.mipdata_->domain.infeasible()) return;
        ++nfixed;
        if (mipsolver.variableType(i) == HighsVarType::kInteger) ++nintfixed;
      }
    }
    if (nfixed > 0)
      highsLogDev(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                  "Fixing %d columns (%d integers) sitting at bound at "
                  "analytic center\n",
                  int(nfixed), int(nintfixed));
    mipsolver.mipdata_->domain.propagate();
    if (mipsolver.mipdata_->domain.infeasible()) return;
  }
}